

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::ExpandArguments
          (cmMakefile *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs,
          vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *outArgs,
          char *filename)

{
  bool bVar1;
  size_type __n;
  reference __args;
  bool local_d9;
  reference local_d8;
  string *stringArg;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringArgs;
  cmListFileArgument *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *__range1;
  undefined1 local_68 [8];
  string value;
  string efp;
  char *filename_local;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *outArgs_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs_local;
  cmMakefile *this_local;
  
  GetExecutionFilePath_abi_cxx11_((string *)((long)&value.field_2 + 8),this);
  efp.field_2._8_8_ = filename;
  if (filename == (char *)0x0) {
    efp.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  std::__cxx11::string::string((string *)local_68);
  __n = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size(inArgs);
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::reserve
            (outArgs,__n);
  __end1 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin(inArgs);
  i = (cmListFileArgument *)
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end(inArgs);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                                     *)&i), bVar1) {
    __args = __gnu_cxx::
             __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
             ::operator*(&__end1);
    if (__args->Delim == Bracket) {
      stringArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
      emplace_back<std::__cxx11::string_const&,bool>
                ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                 outArgs,&__args->Value,
                 (bool *)((long)&stringArgs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    else {
      std::__cxx11::string::operator=((string *)local_68,(string *)__args);
      ExpandVariablesInString
                (this,(string *)local_68,false,false,false,(char *)efp.field_2._8_8_,__args->Line,
                 false,false);
      if (__args->Delim == Quoted) {
        stringArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
        emplace_back<std::__cxx11::string&,bool>
                  ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                   outArgs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68,
                   (bool *)((long)&stringArgs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range3);
        cmSystemTools::ExpandListArgument
                  ((string *)local_68,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range3,false);
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3);
        stringArg = (string *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range3);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&stringArg), bVar1) {
          local_d8 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&__end3);
          local_d9 = false;
          std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
          emplace_back<std::__cxx11::string_const&,bool>
                    ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                     outArgs,local_d8,&local_d9);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range3);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
    ::operator++(&__end1);
  }
  bVar1 = cmSystemTools::GetFatalErrorOccured();
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool cmMakefile::ExpandArguments(
  std::vector<cmListFileArgument> const& inArgs,
  std::vector<cmExpandedCommandArgument>& outArgs, const char* filename) const
{
  std::string efp = this->GetExecutionFilePath();
  if (!filename) {
    filename = efp.c_str();
  }
  std::string value;
  outArgs.reserve(inArgs.size());
  for (cmListFileArgument const& i : inArgs) {
    // No expansion in a bracket argument.
    if (i.Delim == cmListFileArgument::Bracket) {
      outArgs.emplace_back(i.Value, true);
      continue;
    }
    // Expand the variables in the argument.
    value = i.Value;
    this->ExpandVariablesInString(value, false, false, false, filename, i.Line,
                                  false, false);

    // If the argument is quoted, it should be one argument.
    // Otherwise, it may be a list of arguments.
    if (i.Delim == cmListFileArgument::Quoted) {
      outArgs.emplace_back(value, true);
    } else {
      std::vector<std::string> stringArgs;
      cmSystemTools::ExpandListArgument(value, stringArgs);
      for (std::string const& stringArg : stringArgs) {
        outArgs.emplace_back(stringArg, false);
      }
    }
  }
  return !cmSystemTools::GetFatalErrorOccured();
}